

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O2

int h264_cabac_decision(bitstream *str,h264_cabac_context *cabac,int ctxIdx,uint32_t *binVal)

{
  byte bVar1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  
  if (ctxIdx == 0x114) {
    iVar2 = h264_cabac_terminate(str,cabac,binVal);
    return iVar2;
  }
  if (ctxIdx == -1) {
    iVar2 = h264_cabac_bypass(str,cabac,binVal);
    return iVar2;
  }
  bVar1 = rangeTabLPS[cabac->pStateIdx[ctxIdx]][cabac->codIRange >> 6 & 3];
  uVar4 = cabac->codIRange - (uint)bVar1;
  cabac->codIRange = uVar4;
  if (str->dir == VS_ENCODE) {
    if (*binVal == (uint)cabac->valMPS[ctxIdx]) goto LAB_00107485;
    cabac->codIOffset = cabac->codIOffset + uVar4;
  }
  else {
    if (cabac->codIOffset < uVar4) {
      *binVal = (uint)cabac->valMPS[ctxIdx];
      goto LAB_00107485;
    }
    *binVal = (uint)(cabac->valMPS[ctxIdx] == 0);
    cabac->codIOffset = cabac->codIOffset - cabac->codIRange;
  }
  cabac->codIRange = (uint)bVar1;
LAB_00107485:
  if (*binVal == (uint)cabac->valMPS[ctxIdx]) {
    puVar3 = 
    "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$%&\'()*+,-./0123456789:;<=>>?"
    ;
  }
  else {
    puVar3 = "";
    if ((ulong)cabac->pStateIdx[ctxIdx] == 0) {
      cabac->valMPS[ctxIdx] = cabac->valMPS[ctxIdx] == 0;
    }
  }
  cabac->pStateIdx[ctxIdx] = puVar3[cabac->pStateIdx[ctxIdx]];
  iVar2 = h264_cabac_renorm(str,cabac);
  if (iVar2 == 0) {
    cabac->BinCount = cabac->BinCount + 1;
  }
  return (uint)(iVar2 != 0);
}

Assistant:

int h264_cabac_decision(struct bitstream *str, struct h264_cabac_context *cabac, int ctxIdx, uint32_t *binVal) {
	if (ctxIdx == -1)
		return h264_cabac_bypass(str, cabac, binVal);
	if (ctxIdx == H264_CABAC_CTXIDX_TERMINATE)
		return h264_cabac_terminate(str, cabac, binVal);
	int qCodIRangeIdx = cabac->codIRange >> 6 & 3;
	int codIRangeLPS = rangeTabLPS[cabac->pStateIdx[ctxIdx]][qCodIRangeIdx];
	cabac->codIRange -= codIRangeLPS;
	if (str->dir == VS_ENCODE) {
		if (*binVal != cabac->valMPS[ctxIdx]) {
			cabac->codIOffset += cabac->codIRange;
			cabac->codIRange = codIRangeLPS;
		}
	} else {
		if (cabac->codIOffset >= cabac->codIRange) {
			*binVal = !cabac->valMPS[ctxIdx];
			cabac->codIOffset -= cabac->codIRange;
			cabac->codIRange = codIRangeLPS;
		} else {
			*binVal = cabac->valMPS[ctxIdx];
		}
	}
	if (*binVal == cabac->valMPS[ctxIdx]) {
		cabac->pStateIdx[ctxIdx] = transIdxMPS[cabac->pStateIdx[ctxIdx]];
	} else {
		if (cabac->pStateIdx[ctxIdx] == 0)
			cabac->valMPS[ctxIdx] = !cabac->valMPS[ctxIdx];
		cabac->pStateIdx[ctxIdx] = transIdxLPS[cabac->pStateIdx[ctxIdx]];
	}
	if (h264_cabac_renorm(str, cabac))
		return 1;
	cabac->BinCount++;
	return 0;
}